

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O3

PBuffer __thiscall ConvertorPCM2WAV::create_data(ConvertorPCM2WAV *this,PBuffer *data)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  PBuffer PVar2;
  
  peVar1 = *(element_type **)&(in_RDX._M_pi)->_M_use_count;
  (in_RDX._M_pi)->_M_use_count = 0;
  (in_RDX._M_pi)->_M_weak_count = 0;
  (this->super_Convertor)._vptr_Convertor = (in_RDX._M_pi)->_vptr__Sp_counted_base;
  (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (in_RDX._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorPCM2WAV::create_data(PBuffer data) {
  return data;
}